

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O3

bool __thiscall
btConvexHullInternal::mergeProjection
          (btConvexHullInternal *this,IntermediateHull *h0,IntermediateHull *h1,Vertex **c0,
          Vertex **c1)

{
  Vertex *pVVar1;
  Vertex *pVVar2;
  Vertex *pVVar3;
  bool bVar4;
  int32_t x;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  Vertex *pVVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int32_t iVar12;
  Vertex *pVVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Vertex *pVVar17;
  Vertex *pVVar18;
  Vertex *pVVar19;
  Vertex *pVVar20;
  Vertex *pVVar21;
  Vertex *pVVar22;
  int iVar23;
  int iVar24;
  
  pVVar13 = h0->maxYx;
  pVVar8 = h1->minYx;
  if (((pVVar13->point).x == (pVVar8->point).x) && ((pVVar13->point).y == (pVVar8->point).y)) {
    pVVar1 = pVVar8->prev;
    if (pVVar1 == pVVar8) {
      *c0 = pVVar13;
      if (pVVar8->edges != (Edge *)0x0) {
        pVVar8 = pVVar8->edges->target;
      }
      bVar4 = false;
      goto LAB_00128bb1;
    }
    pVVar13 = pVVar8->next;
    pVVar1->next = pVVar13;
    pVVar13->prev = pVVar1;
    if (pVVar8 == h1->minXy) {
      iVar10 = (pVVar1->point).x;
      iVar24 = (pVVar13->point).x;
      pVVar17 = pVVar13;
      if ((iVar10 <= iVar24) && ((iVar24 != iVar10 || ((pVVar1->point).y <= (pVVar13->point).y)))) {
        pVVar17 = pVVar1;
      }
      h1->minXy = pVVar17;
    }
    if (pVVar8 == h1->maxXy) {
      iVar10 = (pVVar1->point).x;
      iVar24 = (pVVar13->point).x;
      if ((iVar24 <= iVar10) && ((iVar24 != iVar10 || ((pVVar13->point).y <= (pVVar1->point).y)))) {
        pVVar13 = pVVar1;
      }
      h1->maxXy = pVVar13;
    }
  }
  pVVar13 = h0->minXy;
  pVVar1 = h0->maxXy;
  pVVar17 = h1->minXy;
  pVVar2 = h1->maxXy;
  iVar10 = 1;
  iVar24 = 1;
  pVVar18 = pVVar2;
  pVVar20 = pVVar1;
  pVVar22 = (Vertex *)0x0;
  pVVar19 = (Vertex *)0x0;
  do {
    pVVar8 = pVVar19;
    pVVar21 = pVVar22;
    iVar11 = (pVVar20->point).x;
    iVar14 = ((pVVar18->point).x - iVar11) * iVar24;
    bVar9 = (byte)iVar10;
    if (0 < iVar14) {
      pVVar22 = pVVar20;
      do {
        pVVar19 = pVVar18;
        iVar11 = (pVVar19->point).y;
        iVar23 = iVar14;
        while( true ) {
          iVar14 = (pVVar22->point).y;
          iVar5 = iVar11 - iVar14;
          pVVar18 = *(Vertex **)((long)&pVVar22->next + (ulong)(uint)(iVar10 << 3));
          if ((pVVar18 == pVVar22) ||
             (iVar16 = (pVVar18->point).y, iVar15 = iVar16 - iVar14, iVar15 != 0 && iVar14 <= iVar16
             )) break;
          iVar14 = (pVVar18->point).x;
          iVar16 = (pVVar22->point).x;
          if ((iVar14 != iVar16) &&
             ((iVar16 = (iVar14 - iVar16) * iVar24, -1 < iVar16 ||
              (iVar16 * iVar5 < iVar15 * iVar23)))) break;
          iVar23 = ((pVVar19->point).x - iVar14) * iVar24;
          pVVar22 = pVVar18;
        }
        pVVar18 = *(Vertex **)((long)&pVVar19->next + (ulong)(uint)(iVar10 << 3));
        if (pVVar18 == pVVar19) goto LAB_00128b34;
        iVar16 = (pVVar18->point).x;
        iVar14 = (iVar16 - (pVVar22->point).x) * iVar24;
        if (((iVar14 < 1) || (iVar11 = (pVVar18->point).y - iVar11, -1 < iVar11)) ||
           ((iVar15 = (pVVar19->point).x, iVar16 != iVar15 &&
            ((iVar16 = (iVar16 - iVar15) * iVar24, -1 < iVar16 ||
             (iVar16 * iVar5 <= iVar11 * iVar23)))))) goto LAB_00128b34;
      } while( true );
    }
    bVar6 = ~bVar9;
    if (iVar14 < 0) {
      uVar7 = (ulong)((bVar6 & 1) << 3);
      pVVar19 = pVVar18;
LAB_00128a80:
      iVar10 = (pVVar19->point).y;
      pVVar18 = *(Vertex **)((long)&pVVar19->next + uVar7);
      pVVar3 = pVVar20;
      do {
        iVar23 = iVar14;
        pVVar20 = pVVar3;
        iVar11 = (pVVar20->point).y;
        iVar5 = iVar10 - iVar11;
        if ((pVVar18 != pVVar19) && (iVar14 = (pVVar18->point).y - iVar10, -1 < iVar14)) {
          iVar16 = (pVVar18->point).x;
          iVar15 = (pVVar19->point).x;
          if ((iVar16 == iVar15) ||
             ((iVar15 = (iVar16 - iVar15) * iVar24, iVar15 < 0 &&
              (iVar14 * iVar23 <= iVar15 * iVar5)))) goto LAB_00128b1e;
        }
        pVVar3 = *(Vertex **)((long)&pVVar20->next + uVar7);
        pVVar22 = pVVar20;
        if (pVVar3 == pVVar20) goto LAB_00128b34;
        iVar16 = (pVVar3->point).x;
        iVar14 = ((pVVar19->point).x - iVar16) * iVar24;
        if (((-1 < iVar14) || (iVar11 = (pVVar3->point).y - iVar11, iVar11 < 1)) ||
           ((iVar15 = (pVVar20->point).x, iVar16 != iVar15 &&
            ((iVar16 = (iVar16 - iVar15) * iVar24, -1 < iVar16 ||
             (iVar16 * iVar5 <= iVar11 * iVar23)))))) goto LAB_00128b34;
      } while( true );
    }
    pVVar19 = pVVar20;
    iVar12 = (pVVar20->point).y;
    do {
      pVVar22 = pVVar19;
      pVVar19 = *(Vertex **)((long)&pVVar22->next + (ulong)(uint)(iVar10 << 3));
      if ((pVVar19 == pVVar20) || ((pVVar19->point).x != iVar11)) break;
      iVar24 = (pVVar19->point).y;
      bVar4 = iVar24 <= iVar12;
      iVar12 = iVar24;
    } while (bVar4);
    pVVar20 = pVVar18;
    iVar12 = (pVVar18->point).y;
    do {
      pVVar19 = pVVar20;
      pVVar20 = *(Vertex **)((long)&pVVar19->next + (ulong)((bVar6 & 1) << 3));
      if ((pVVar20 == pVVar18) || ((pVVar20->point).x != iVar11)) break;
      iVar10 = (pVVar20->point).y;
      bVar4 = iVar12 <= iVar10;
      iVar12 = iVar10;
    } while (bVar4);
LAB_00128b34:
    iVar24 = -1;
    iVar10 = 0;
    pVVar18 = pVVar17;
    pVVar20 = pVVar13;
  } while (bVar9 != 0);
  pVVar22->prev = pVVar19;
  pVVar19->next = pVVar22;
  pVVar21->next = pVVar8;
  pVVar8->prev = pVVar21;
  if ((pVVar17->point).x < (pVVar13->point).x) {
    h0->minXy = pVVar17;
  }
  if ((pVVar1->point).x <= (pVVar2->point).x) {
    h0->maxXy = pVVar2;
  }
  h0->maxYx = h1->maxYx;
  *c0 = pVVar21;
  bVar4 = true;
LAB_00128bb1:
  *c1 = pVVar8;
  return bVar4;
LAB_00128b1e:
  iVar14 = (iVar16 - (pVVar20->point).x) * iVar24;
  pVVar19 = pVVar18;
  goto LAB_00128a80;
}

Assistant:

bool btConvexHullInternal::mergeProjection(IntermediateHull& h0, IntermediateHull& h1, Vertex*& c0, Vertex*& c1)
{
	Vertex* v0 = h0.maxYx;
	Vertex* v1 = h1.minYx;
	if ((v0->point.x == v1->point.x) && (v0->point.y == v1->point.y))
	{
		btAssert(v0->point.z < v1->point.z);
		Vertex* v1p = v1->prev;
		if (v1p == v1)
		{
			c0 = v0;
			if (v1->edges)
			{
				btAssert(v1->edges->next == v1->edges);
				v1 = v1->edges->target;
				btAssert(v1->edges->next == v1->edges);
			}
			c1 = v1;
			return false;
		}
		Vertex* v1n = v1->next;
		v1p->next = v1n;
		v1n->prev = v1p;
		if (v1 == h1.minXy)
		{
			if ((v1n->point.x < v1p->point.x) || ((v1n->point.x == v1p->point.x) && (v1n->point.y < v1p->point.y)))
			{
				h1.minXy = v1n;
			}
			else
			{
				h1.minXy = v1p;
			}
		}
		if (v1 == h1.maxXy)
		{
			if ((v1n->point.x > v1p->point.x) || ((v1n->point.x == v1p->point.x) && (v1n->point.y > v1p->point.y)))
			{
				h1.maxXy = v1n;
			}
			else
			{
				h1.maxXy = v1p;
			}
		}
	}
	
	v0 = h0.maxXy;
	v1 = h1.maxXy;
	Vertex* v00 = NULL;
	Vertex* v10 = NULL;
	int32_t sign = 1;

	for (int side = 0; side <= 1; side++)
	{		
		int32_t dx = (v1->point.x - v0->point.x) * sign;
		if (dx > 0)
		{
			while (true)
			{
				int32_t dy = v1->point.y - v0->point.y;

				Vertex* w0 = side ? v0->next : v0->prev;
				if (w0 != v0)
				{
					int32_t dx0 = (w0->point.x - v0->point.x) * sign;
					int32_t dy0 = w0->point.y - v0->point.y;
					if ((dy0 <= 0) && ((dx0 == 0) || ((dx0 < 0) && (dy0 * dx <= dy * dx0))))
					{
						v0 = w0;
						dx = (v1->point.x - v0->point.x) * sign;
						continue;
					}
				}

				Vertex* w1 = side ? v1->next : v1->prev;
				if (w1 != v1)
				{
					int32_t dx1 = (w1->point.x - v1->point.x) * sign;
					int32_t dy1 = w1->point.y - v1->point.y;
					int32_t dxn = (w1->point.x - v0->point.x) * sign;
					if ((dxn > 0) && (dy1 < 0) && ((dx1 == 0) || ((dx1 < 0) && (dy1 * dx < dy * dx1))))
					{
						v1 = w1;
						dx = dxn;
						continue;
					}
				}

				break;
			}
		}
		else if (dx < 0)
		{
			while (true)
			{
				int32_t dy = v1->point.y - v0->point.y;
				
				Vertex* w1 = side ? v1->prev : v1->next;
				if (w1 != v1)
				{
					int32_t dx1 = (w1->point.x - v1->point.x) * sign;
					int32_t dy1 = w1->point.y - v1->point.y;
					if ((dy1 >= 0) && ((dx1 == 0) || ((dx1 < 0) && (dy1 * dx <= dy * dx1))))
					{
						v1 = w1;
						dx = (v1->point.x - v0->point.x) * sign;
						continue;
					}
				}
				
				Vertex* w0 = side ? v0->prev : v0->next;
				if (w0 != v0)
				{
					int32_t dx0 = (w0->point.x - v0->point.x) * sign;
					int32_t dy0 = w0->point.y - v0->point.y;
					int32_t dxn = (v1->point.x - w0->point.x) * sign;
					if ((dxn < 0) && (dy0 > 0) && ((dx0 == 0) || ((dx0 < 0) && (dy0 * dx < dy * dx0))))
					{
						v0 = w0;
						dx = dxn;
						continue;
					}
				}
				
				break;
			}
		}
		else
		{
			int32_t x = v0->point.x;
			int32_t y0 = v0->point.y;
			Vertex* w0 = v0;
			Vertex* t;
			while (((t = side ? w0->next : w0->prev) != v0) && (t->point.x == x) && (t->point.y <= y0))
			{
				w0 = t;
				y0 = t->point.y;
			}
			v0 = w0;

			int32_t y1 = v1->point.y;
			Vertex* w1 = v1;
			while (((t = side ? w1->prev : w1->next) != v1) && (t->point.x == x) && (t->point.y >= y1))
			{
				w1 = t;
				y1 = t->point.y;
			}
			v1 = w1;
		}
		
		if (side == 0)
		{
			v00 = v0;
			v10 = v1;

			v0 = h0.minXy;
			v1 = h1.minXy;
			sign = -1;
		}
	}

	v0->prev = v1;
	v1->next = v0;

	v00->next = v10;
	v10->prev = v00;

	if (h1.minXy->point.x < h0.minXy->point.x)
	{
		h0.minXy = h1.minXy;
	}
	if (h1.maxXy->point.x >= h0.maxXy->point.x)
	{
		h0.maxXy = h1.maxXy;
	}
	
	h0.maxYx = h1.maxYx;

	c0 = v00;
	c1 = v10;

	return true;
}